

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O2

QRect __thiscall QCommandLinkButtonPrivate::titleRect(QCommandLinkButtonPrivate *this)

{
  QWidget *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_var;
  int iVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect QVar6;
  QSize local_58;
  QFontMetrics fm;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.
              field_0x8;
  QVar5 = QWidget::rect(this_00);
  iVar1 = textOffset(this);
  iVar4 = QVar5.y1.m_i.m_i + 10;
  if ((this->description).d.size == 0) {
    _fm = &DAT_aaaaaaaaaaaaaaaa;
    titleFont((QCommandLinkButtonPrivate *)&stack0xffffffffffffffb8);
    QFontMetrics::QFontMetrics(&fm,(QFont *)&stack0xffffffffffffffb8);
    QFont::~QFont((QFont *)&stack0xffffffffffffffb8);
    QAbstractButton::icon((QAbstractButton *)&stack0xffffffffffffffb8);
    local_58 = QAbstractButton::iconSize((QAbstractButton *)this_00);
    QIcon::actualSize((QSize *)&stack0xffffffffffffffb8,(Mode)&local_58,On);
    iVar2 = QFontMetrics::height();
    iVar3 = (extraout_var - iVar2) / 2;
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar4 = iVar2 + iVar4;
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffb8);
    QFontMetrics::~QFontMetrics(&fm);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar6.y1.m_i = iVar4;
    QVar6.x1.m_i = iVar1 + QVar5.x1.m_i.m_i;
    QVar6._8_8_ = (ulong)(QVar5.x2.m_i.m_i - 4) | QVar5._8_8_ & 0xffffffff00000000;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QCommandLinkButtonPrivate::titleRect() const
{
    Q_Q(const QCommandLinkButton);
    QRect r = q->rect().adjusted(textOffset(), topMargin(), -rightMargin(), 0);
    if (description.isEmpty())
    {
        QFontMetrics fm(titleFont());
        r.setTop(r.top() + qMax(0, (q->icon().actualSize(q->iconSize()).height()
                 - fm.height()) / 2));
    }

    return r;
}